

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O1

GCproto * lj_bcread_proto(LexState *ls)

{
  char **pp;
  long *plVar1;
  ushort *puVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  lua_State *plVar6;
  short sVar7;
  byte bVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  GCproto *pt;
  ulong uVar18;
  GCstr *pGVar19;
  void *pvVar20;
  GCtab *t;
  TValue *pTVar21;
  char *pcVar22;
  byte bVar23;
  size_t __n;
  long lVar24;
  uint32_t hbits;
  GCSize size;
  double *pdVar25;
  uint uVar26;
  byte *pbVar27;
  uint uVar28;
  int iVar29;
  anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *paVar30;
  TValue local_38;
  
  pp = &ls->p;
  pbVar27 = (byte *)ls->p;
  ls->p = (char *)(pbVar27 + 1);
  bVar8 = *pbVar27;
  ls->p = (char *)(pbVar27 + 2);
  bVar23 = pbVar27[1];
  ls->p = (char *)(pbVar27 + 3);
  bVar3 = pbVar27[2];
  ls->p = (char *)(pbVar27 + 4);
  bVar4 = pbVar27[3];
  uVar9 = lj_buf_ruleb128(pp);
  uVar10 = lj_buf_ruleb128(pp);
  uVar11 = lj_buf_ruleb128(pp);
  uVar28 = uVar11 + 1;
  uVar13 = 0;
  uVar14 = 0;
  __n = 0;
  if ((ls->level & 2) == 0) {
    uVar12 = lj_buf_ruleb128(pp);
    uVar13 = 0;
    uVar14 = 0;
    __n = 0;
    if (uVar12 != 0) {
      uVar13 = lj_buf_ruleb128(pp);
      uVar14 = lj_buf_ruleb128(pp);
      __n = (size_t)uVar12;
    }
  }
  uVar26 = (uVar9 + uVar28) * 4 + 0x47 & 0xfffffff8;
  iVar29 = uVar26 + uVar10 * 8;
  uVar15 = ((uint)bVar4 * 2 + 2 & 0xfffffffc) + iVar29;
  size = (int)__n + uVar15;
  pt = (GCproto *)lj_mem_newgco(ls->L,size);
  pt->gct = '\a';
  pt->numparams = bVar23;
  pt->framesize = bVar3;
  pt->sizebc = uVar28;
  lVar24 = (long)&(pt->nextgc).gcptr32 + (ulong)uVar26;
  (pt->k).ptr32 = (uint32_t)lVar24;
  (pt->uv).ptr32 = iVar29 + (int)pt;
  pt->sizekgc = 0;
  pt->sizekn = uVar10;
  pt->sizept = size;
  pt->sizeuv = bVar4;
  pt->flags = bVar8;
  pt->trace = 0;
  (pt->chunkname).gcptr32 = *(uint32_t *)&ls->chunkname;
  *(undefined4 *)(lVar24 + (ulong)(uVar9 + 1) * -4) = 0;
  bVar8 = (bVar8 & 2) >> 1;
  pt[1].nextgc.gcptr32 = (uint)bVar8 + (uint)bVar8 * 2 + (uint)bVar3 * 0x100 + 0x59;
  uVar18 = (ulong)(uVar28 * 4 - 4);
  pcVar22 = ls->p;
  ls->p = pcVar22 + uVar18;
  memcpy(&pt[1].marked,pcVar22,uVar18);
  if ((1 < uVar28) && ((ls->level & 1) != 0)) {
    lVar24 = 0;
    do {
      uVar26 = *(uint *)(&pt[1].marked + lVar24 * 4);
      *(uint *)(&pt[1].marked + lVar24 * 4) =
           uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 | uVar26 << 0x18;
      lVar24 = lVar24 + 1;
    } while ((ulong)uVar28 - 1 != lVar24);
  }
  if (bVar4 != 0) {
    pvVar20 = (void *)(ulong)(pt->uv).ptr32;
    pcVar22 = ls->p;
    ls->p = pcVar22 + ((uint)bVar4 + (uint)bVar4);
    memcpy(pvVar20,pcVar22,(ulong)((uint)bVar4 + (uint)bVar4));
    if ((ls->level & 1) != 0) {
      uVar18 = 0;
      do {
        puVar2 = (ushort *)((long)pvVar20 + uVar18 * 2);
        *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
        uVar18 = uVar18 + 1;
      } while (bVar4 != uVar18);
    }
  }
  if (uVar9 != 0) {
    paVar30 = (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
              ((ulong)(pt->k).ptr32 + (ulong)uVar9 * -4);
    uVar12 = 0;
    do {
      uVar16 = lj_buf_ruleb128(pp);
      if (uVar16 < 5) {
        if (uVar16 == 0) {
          plVar6 = ls->L;
          pTVar21 = plVar6->top;
          if (pTVar21 <= (TValue *)((long)ls->lastline + (ulong)(plVar6->stack).ptr32)) {
            bcread_error(ls,LJ_ERR_BCBAD);
          }
          plVar6->top = pTVar21 + -1;
          *paVar30 = pTVar21[-1].field_2.field_0;
        }
        else if (uVar16 == 1) {
          uVar17 = lj_buf_ruleb128(pp);
          uVar16 = lj_buf_ruleb128(pp);
          if (uVar16 == 0) {
            hbits = 0;
          }
          else {
            hbits = 1;
            if (uVar16 != 1) {
              uVar28 = 0x1f;
              if (uVar16 - 1 != 0) {
                for (; uVar16 - 1 >> uVar28 == 0; uVar28 = uVar28 - 1) {
                }
              }
              hbits = (uVar28 ^ 0xffffffe0) + 0x21;
            }
          }
          t = lj_tab_new(ls->L,uVar17,hbits);
          if (uVar17 != 0) {
            pTVar21 = (TValue *)(ulong)(t->array).ptr32;
            do {
              bcread_ktabk(ls,pTVar21);
              pTVar21 = pTVar21 + 1;
              uVar17 = uVar17 - 1;
            } while (uVar17 != 0);
          }
          for (; uVar16 != 0; uVar16 = uVar16 - 1) {
            bcread_ktabk(ls,&local_38);
            pTVar21 = lj_tab_set(ls->L,t,&local_38);
            bcread_ktabk(ls,pTVar21);
          }
          paVar30->i = (int32_t)t;
        }
        else {
          plVar6 = ls->L;
          sVar7 = (uVar16 != 2) + 0xb;
          if (uVar16 == 4) {
            sVar7 = 0x10;
          }
          pvVar20 = lj_mem_newgco(plVar6,(uint)(uVar16 == 4) * 8 + 0x10);
          *(undefined1 *)((long)pvVar20 + 5) = 10;
          *(short *)((long)pvVar20 + 6) = sVar7;
          plVar1 = (long *)((ulong)(plVar6->glref).ptr32 + 0xe0);
          *plVar1 = *plVar1 + 1;
          paVar30->i = (int32_t)pvVar20;
          uVar17 = lj_buf_ruleb128(pp);
          *(uint32_t *)((long)pvVar20 + 8) = uVar17;
          uVar17 = lj_buf_ruleb128(pp);
          *(uint32_t *)((long)pvVar20 + 0xc) = uVar17;
          if (uVar16 == 4) {
            uVar16 = lj_buf_ruleb128(pp);
            *(uint32_t *)((long)pvVar20 + 0x10) = uVar16;
            uVar16 = lj_buf_ruleb128(pp);
            *(uint32_t *)((long)pvVar20 + 0x14) = uVar16;
          }
        }
      }
      else {
        pcVar22 = ls->p;
        ls->p = pcVar22 + (uVar16 - 5);
        pGVar19 = lj_str_new(ls->L,pcVar22,(ulong)(uVar16 - 5));
        paVar30->i = (int32_t)pGVar19;
      }
      uVar12 = uVar12 + 1;
      paVar30 = paVar30 + 1;
    } while (uVar12 != uVar9);
  }
  pt->sizekgc = uVar9;
  if (uVar10 != 0) {
    pdVar25 = (double *)(ulong)(pt->k).ptr32;
    uVar9 = 0;
    do {
      bVar8 = **pp;
      pbVar27 = (byte *)(*pp + 1);
      uVar28 = (uint)(bVar8 >> 1);
      if ((char)bVar8 < '\0') {
        uVar28 = uVar28 & 0x3f;
        bVar23 = 6;
        do {
          bVar3 = *pbVar27;
          uVar28 = uVar28 | (bVar3 & 0x7f) << (bVar23 & 0x1f);
          pbVar27 = pbVar27 + 1;
          bVar23 = bVar23 + 7;
        } while ((char)bVar3 < '\0');
      }
      *pp = (char *)pbVar27;
      if ((bVar8 & 1) == 0) {
        *pdVar25 = (double)(int)uVar28;
      }
      else {
        *(uint *)pdVar25 = uVar28;
        uVar12 = lj_buf_ruleb128(pp);
        *(uint32_t *)((long)pdVar25 + 4) = uVar12;
      }
      uVar9 = uVar9 + 1;
      pdVar25 = pdVar25 + 1;
    } while (uVar9 != uVar10);
  }
  pt->firstline = uVar13;
  pt->numline = uVar14;
  if ((int)__n == 0) {
    pt->lineinfo = 0;
    pt->uvinfo = 0;
    uVar28 = 0;
  }
  else {
    bVar8 = 2 - ((int)uVar14 < 0x10000);
    if ((int)uVar14 < 0x100) {
      bVar8 = 0;
    }
    uVar18 = (long)&(pt->nextgc).gcptr32 + (ulong)uVar15;
    uVar9 = (uint32_t)uVar18;
    (pt->lineinfo).ptr32 = uVar9;
    (pt->uvinfo).ptr32 = (uVar11 << (bVar8 & 0x1f)) + uVar9;
    pvVar20 = (void *)(uVar18 & 0xffffffff);
    pcVar22 = ls->p;
    ls->p = pcVar22 + __n;
    memcpy(pvVar20,pcVar22,__n);
    if (((ls->level & 1) != 0) && (0xff < pt->numline)) {
      uVar28 = pt->sizebc - 1;
      if (pt->numline < 0x10000) {
        if (uVar28 != 0) {
          uVar18 = 0;
          do {
            puVar2 = (ushort *)((long)pvVar20 + uVar18 * 2);
            *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
            uVar18 = uVar18 + 1;
          } while (uVar28 != uVar18);
        }
      }
      else if (uVar28 != 0) {
        uVar18 = 0;
        do {
          uVar15 = *(uint *)((long)pvVar20 + uVar18 * 4);
          *(uint *)((long)pvVar20 + uVar18 * 4) =
               uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18;
          uVar18 = uVar18 + 1;
        } while (uVar28 != uVar18);
      }
    }
    uVar28 = (pt->uvinfo).ptr32;
    pcVar22 = (char *)(ulong)uVar28;
    uVar15 = (uint)pt->sizeuv;
    if (pt->sizeuv != 0) {
      do {
        uVar18 = (ulong)pcVar22 & 0xffffffff;
        do {
          uVar28 = (int)uVar18 + 1;
          uVar18 = (ulong)uVar28;
          cVar5 = *pcVar22;
          pcVar22 = pcVar22 + 1;
        } while (cVar5 != '\0');
        uVar15 = uVar15 - 1;
      } while (uVar15 != 0);
    }
  }
  (pt->varinfo).ptr32 = uVar28;
  lj_memprof_add_proto(pt);
  lj_sysprof_add_proto(pt);
  return pt;
}

Assistant:

GCproto *lj_bcread_proto(LexState *ls)
{
  GCproto *pt;
  MSize framesize, numparams, flags, sizeuv, sizekgc, sizekn, sizebc, sizept;
  MSize ofsk, ofsuv, ofsdbg;
  MSize sizedbg = 0;
  BCLine firstline = 0, numline = 0;

  /* Read prototype header. */
  flags = bcread_byte(ls);
  numparams = bcread_byte(ls);
  framesize = bcread_byte(ls);
  sizeuv = bcread_byte(ls);
  sizekgc = bcread_uleb128(ls);
  sizekn = bcread_uleb128(ls);
  sizebc = bcread_uleb128(ls) + 1;
  if (!(bcread_flags(ls) & BCDUMP_F_STRIP)) {
    sizedbg = bcread_uleb128(ls);
    if (sizedbg) {
      firstline = bcread_uleb128(ls);
      numline = bcread_uleb128(ls);
    }
  }

  /* Calculate total size of prototype including all colocated arrays. */
  sizept = (MSize)sizeof(GCproto) +
	   sizebc*(MSize)sizeof(BCIns) +
	   sizekgc*(MSize)sizeof(GCRef);
  sizept = (sizept + (MSize)sizeof(TValue)-1) & ~((MSize)sizeof(TValue)-1);
  ofsk = sizept; sizept += sizekn*(MSize)sizeof(TValue);
  ofsuv = sizept; sizept += ((sizeuv+1)&~1)*2;
  ofsdbg = sizept; sizept += sizedbg;

  /* Allocate prototype object and initialize its fields. */
  pt = (GCproto *)lj_mem_newgco(ls->L, (MSize)sizept);
  pt->gct = ~LJ_TPROTO;
  pt->numparams = (uint8_t)numparams;
  pt->framesize = (uint8_t)framesize;
  pt->sizebc = sizebc;
  setmref(pt->k, (char *)pt + ofsk);
  setmref(pt->uv, (char *)pt + ofsuv);
  pt->sizekgc = 0;  /* Set to zero until fully initialized. */
  pt->sizekn = sizekn;
  pt->sizept = sizept;
  pt->sizeuv = (uint8_t)sizeuv;
  pt->flags = (uint8_t)flags;
  pt->trace = 0;
  setgcref(pt->chunkname, obj2gco(ls->chunkname));

  /* Close potentially uninitialized gap between bc and kgc. */
  *(uint32_t *)((char *)pt + ofsk - sizeof(GCRef)*(sizekgc+1)) = 0;

  /* Read bytecode instructions and upvalue refs. */
  bcread_bytecode(ls, pt, sizebc);
  bcread_uv(ls, pt, sizeuv);

  /* Read constants. */
  bcread_kgc(ls, pt, sizekgc);
  pt->sizekgc = sizekgc;
  bcread_knum(ls, pt, sizekn);

  /* Read and initialize debug info. */
  pt->firstline = firstline;
  pt->numline = numline;
  if (sizedbg) {
    MSize sizeli = (sizebc-1) << (numline < 256 ? 0 : numline < 65536 ? 1 : 2);
    setmref(pt->lineinfo, (char *)pt + ofsdbg);
    setmref(pt->uvinfo, (char *)pt + ofsdbg + sizeli);
    bcread_dbg(ls, pt, sizedbg);
    setmref(pt->varinfo, bcread_varinfo(pt));
  } else {
    setmref(pt->lineinfo, NULL);
    setmref(pt->uvinfo, NULL);
    setmref(pt->varinfo, NULL);
  }

  /* Add a new prototype to the profiler. */
#if LJ_HASMEMPROF
  lj_memprof_add_proto(pt);
#endif

#if LJ_HASSYSPROF
  lj_sysprof_add_proto(pt);
#endif

  return pt;
}